

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::TableFunction(Relation *this,string *fname,vector<duckdb::Value,_true> *values)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  vector<duckdb::Value,_true> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::Relation,_true> sVar3;
  undefined1 local_69;
  shared_ptr<duckdb::TableFunctionRelation,_true> local_68;
  undefined1 local_58 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr<duckdb::TableFunctionRelation> local_38;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&fname->field_2 + 8));
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_58);
  enable_shared_from_this<duckdb::Relation>::shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)(local_58 + 0x10));
  local_38.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::TableFunctionRelation,std::allocator<duckdb::TableFunctionRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>,std::__cxx11::string_const&,duckdb::vector<duckdb::Value,true>const&,duckdb::shared_ptr<duckdb::Relation,true>>
            (&local_38.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(TableFunctionRelation **)&local_38,
             (allocator<duckdb::TableFunctionRelation> *)&local_69,
             (shared_ptr<duckdb::ClientContext,_true> *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values,in_RCX,
             (shared_ptr<duckdb::Relation,_true> *)(local_58 + 0x10));
  shared_ptr<duckdb::TableFunctionRelation,_true>::shared_ptr(&local_68,&local_38);
  _Var2._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_68.internal.
                super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_68.internal.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_68.internal.
       super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_68.internal.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    _Var2._M_pi = extraout_RDX_01;
  }
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var2._M_pi = extraout_RDX_02;
  }
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::TableFunction(const std::string &fname, const vector<Value> &values) {
	return make_shared_ptr<TableFunctionRelation>(context->GetContext(), fname, values, shared_from_this());
}